

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeUpperStatus
          (SPxSolverBase<double> *this,int i,double newUpper,double oldUpper)

{
  SPxSolverBase<double> *pSVar1;
  bool bVar2;
  Representation RVar3;
  Status SVar4;
  double *pdVar5;
  element_type *peVar6;
  string *m;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *in_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  double objChange;
  double currLower;
  Status *stat;
  double in_stack_ffffffffffffff28;
  int iVar8;
  SPxLPBase<double> *in_stack_ffffffffffffff30;
  allocator *this_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff48;
  SPxSolverBase<double> *in_stack_ffffffffffffff50;
  SPxBasisBase<double> *in_stack_ffffffffffffff58;
  allocator local_59;
  string local_58 [32];
  double local_38;
  double local_30;
  Status *local_28;
  double local_20;
  SPxSolverBase<double> *local_18;
  int local_c [3];
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  local_28 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_ffffffffffffff30,
                        (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  pdVar5 = SPxLPBase<double>::lower
                     (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  local_30 = *pdVar5;
  local_38 = 0.0;
  SPxOut::
  debug<soplex::SPxSolverBase<double>,_const_char_(&)[48],_int_&,_double_&,_double_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
            (in_RDI,(char (*) [48])"DCHANG02 changeUpperStatus(): col {} [{}:{}] {}",local_c,
             &local_30,(double *)&local_18,local_28);
  pSVar1 = local_18;
  switch(*local_28) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    RVar3 = rep(in_RDI);
    if ((RVar3 == ROW) && (0.0 < in_RDI->theShift)) {
      forceRecompNonbasicValue(in_RDI);
    }
    SVar4 = SPxBasisBase<double>::dualColStatus
                      (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    *local_28 = SVar4;
    break;
  case P_FIXED:
    tolerances(in_RDI);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x217fef);
    Tolerances::epsilon(peVar6);
    bVar2 = NE<double,double,double>
                      ((double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       1.08470482127814e-317);
    iVar8 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    in_stack_ffffffffffffff48 = local_18;
    if (bVar2) {
      *local_28 = P_ON_LOWER;
      bVar2 = isInitialized(in_RDI);
      in_stack_ffffffffffffff48 = local_18;
      if (bVar2) {
        pdVar5 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff30,iVar8);
        dVar7 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8);
        *pdVar5 = dVar7;
        in_stack_ffffffffffffff48 = local_18;
      }
    }
    break;
  default:
    m = (string *)__cxa_allocate_exception(0x28);
    this_00 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"XCHANG02 This should never happen.",this_00);
    SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)this_00,m);
    __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  case P_ON_LOWER:
    if (((double)local_18 == local_30) && (!NAN((double)local_18) && !NAN(local_30))) {
      *local_28 = P_FIXED;
    }
    break;
  case P_ON_UPPER:
    pdVar5 = (double *)infinity();
    dVar7 = local_30;
    if ((double)pSVar1 < *pdVar5) {
      tolerances(in_RDI);
      peVar6 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x217e57);
      Tolerances::epsilon(peVar6);
      bVar2 = EQ<double,double,double>
                        ((double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         1.08450324249464e-317);
      iVar8 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (bVar2) {
        *local_28 = P_FIXED;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff30,iVar8);
          local_38 = *pdVar5 * ((double)local_18 - local_20);
        }
      }
      else if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) &&
              (RVar3 = rep(in_RDI), RVar3 == COLUMN)) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8);
        local_38 = *pdVar5 * ((double)local_18 - local_20);
      }
    }
    else {
      pdVar5 = (double *)infinity();
      iVar8 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (-*pdVar5 < dVar7) {
        *local_28 = P_ON_LOWER;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8);
          dVar7 = *pdVar5 * local_30;
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8);
          local_38 = dVar7 - *pdVar5 * local_20;
        }
      }
      else {
        *local_28 = P_FREE;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8);
          local_38 = -*pdVar5 * local_20;
        }
      }
    }
    break;
  case P_FREE:
    in_stack_ffffffffffffff50 = local_18;
    pdVar5 = (double *)infinity();
    iVar8 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if ((((double)in_stack_ffffffffffffff50 < *pdVar5) &&
        (*local_28 = P_ON_UPPER, (in_RDI->m_nonbasicValueUpToDate & 1U) != 0)) &&
       (RVar3 = rep(in_RDI), RVar3 == COLUMN)) {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff30,iVar8)
      ;
      local_38 = *pdVar5 * (double)local_18;
    }
  }
  SPxOut::
  debug<soplex::SPxSolverBase<double>,_const_char_(&)[8],_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
            (in_RDI,(char (*) [8])0x7e8819,local_28);
  RVar3 = rep(in_RDI);
  if (RVar3 == COLUMN) {
    updateNonbasicValue(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpperStatus(int i, R newUpper, R oldUpper)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().colStatus(i);
   R                    currLower = this->lower(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG02 changeUpperStatus(): col {} [{}:{}] {}", i, currLower, newUpper,
                 stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newUpper == currLower)
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(newUpper >= R(infinity))
      {
         if(currLower <= R(-infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theUCbound[i] * oldUpper;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLCbound[i] * currLower) - (theUCbound[i] * oldUpper);
         }
      }
      else if(EQ(newUpper, currLower, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxObj(i) * (newUpper - oldUpper);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theUCbound[i] * (newUpper - oldUpper);

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newUpper < R(infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theUCbound[i] * newUpper;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newUpper, currLower, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(isInitialized())
            theLCbound[i] = this->maxObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualColStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG02 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}